

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O3

Logon * SuiteSessionTests::createFIX40Logon
                  (Logon *__return_storage_ptr__,char *sender,char *target,int seq)

{
  FieldBase local_80;
  
  FIX40::Logon::Logon(__return_storage_ptr__);
  FIX::IntField::IntField((IntField *)&local_80,0x62,0);
  local_80._vptr_FieldBase = (_func_int **)&PTR__FieldBase_00325120;
  FIX::FieldMap::setField((FieldMap *)__return_storage_ptr__,&local_80,true);
  FIX::FieldBase::~FieldBase(&local_80);
  FIX::IntField::IntField((IntField *)&local_80,0x6c,0x1e);
  local_80._vptr_FieldBase = (_func_int **)&PTR__FieldBase_00325158;
  FIX::FieldMap::setField((FieldMap *)__return_storage_ptr__,&local_80,true);
  FIX::FieldBase::~FieldBase(&local_80);
  fillHeader((Header *)&(__return_storage_ptr__->super_Message).field_0x70,sender,target,seq);
  return __return_storage_ptr__;
}

Assistant:

FIX40::Logon createFIX40Logon( const char* sender, const char* target, int seq )
{
  FIX40::Logon logon;
  logon.set( EncryptMethod( 0 ) );
  logon.set( HeartBtInt( 30 ) );
  fillHeader( logon.getHeader(), sender, target, seq );
  return logon;
}